

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

int ON_String::FormatVargsIntoBuffer(ON_StringBuffer *buffer,char *format,__va_list_tag *args)

{
  bool bVar1;
  int local_64;
  size_t local_60;
  size_t buffer_capacity;
  undefined1 auStack_48 [4];
  int rc;
  va_list args_copy;
  __va_list_tag *args_local;
  char *format_local;
  ON_StringBuffer *buffer_local;
  
  args_copy[0].overflow_arg_area = args->reg_save_area;
  auStack_48 = args->gp_offset;
  unique0x1000009d = args->fp_offset;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  local_64 = FormatVargsOutputCount(format,(__va_list_tag *)auStack_48);
  if (local_64 < 1) {
    local_60 = 1;
  }
  else {
    local_60 = (long)local_64 + 1;
  }
  bVar1 = ON_StringBuffer::GrowBuffer(buffer,local_60);
  if (((bVar1) && (buffer->m_buffer != (char *)0x0)) && (buffer->m_buffer_capacity != 0)) {
    *buffer->m_buffer = '\0';
    buffer->m_buffer[buffer->m_buffer_capacity - 1] = '\0';
    buffer_capacity._4_4_ = local_64;
    if (0 < local_64) {
      buffer_capacity._4_4_ =
           FormatVargsIntoBuffer(buffer->m_buffer,buffer->m_buffer_capacity,format,args);
    }
    buffer_local._4_4_ = buffer_capacity._4_4_;
  }
  else {
    if (-1 < local_64) {
      local_64 = -1;
    }
    buffer_local._4_4_ = local_64;
  }
  return buffer_local._4_4_;
}

Assistant:

int ON_String::FormatVargsIntoBuffer(
  ON_StringBuffer& buffer,
  const char* format,
  va_list args
  )
{
  va_list args_copy;
  va_copy(args_copy, args);
  int rc = ON_String::FormatVargsOutputCount(format, args_copy);
  va_end(args_copy);

  size_t buffer_capacity = (rc <= 0) ? 1 : (size_t(rc) + 1);
  if (false == buffer.GrowBuffer(buffer_capacity) || nullptr == buffer.m_buffer || buffer.m_buffer_capacity <= 0)
    return (rc < 0 ? rc : -1);

  buffer.m_buffer[0] = 0;
  buffer.m_buffer[buffer.m_buffer_capacity - 1] = 0;
  if (rc > 0)
  {
    rc = ON_String::FormatVargsIntoBuffer(buffer.m_buffer, buffer.m_buffer_capacity, format, args);
  }
  return rc;
}